

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int diffie_hellman_sha1(LIBSSH2_SESSION *session,BIGNUM *g,BIGNUM *p,int group_order,
                       uchar packet_type_init,uchar packet_type_reply,uchar *midhash,
                       unsigned_long midhash_len,kmdhgGPshakex_state_t *exchange_state)

{
  void *pvVar1;
  undefined8 *puVar2;
  EVP_MD_CTX *pEVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  BN_CTX *pBVar7;
  BIGNUM *pBVar8;
  uchar *puVar9;
  undefined8 uVar10;
  size_t sVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  undefined4 uVar15;
  ulong local_108;
  unsigned_long len_5;
  EVP_MD_CTX *hash_5;
  void *pvStack_f0;
  int free_key_1;
  uchar *key_1;
  unsigned_long len_4;
  EVP_MD_CTX *hash_4;
  void *pvStack_d0;
  int free_key;
  uchar *key;
  unsigned_long len_3;
  EVP_MD_CTX *hash_3;
  unsigned_long len_2;
  EVP_MD_CTX *hash_2;
  int free_secret_1;
  int free_iv_1;
  uchar *secret_1;
  uchar *iv_1;
  unsigned_long len_1;
  EVP_MD_CTX *hash_1;
  unsigned_long len;
  EVP_MD_CTX *hash;
  int free_secret;
  int free_iv;
  uchar *secret;
  uchar *iv;
  EVP_MD_CTX *fingerprint_ctx_1;
  EVP_MD_CTX *fingerprint_ctx;
  EVP_MD_CTX *pEStack_40;
  int burn_type;
  EVP_MD_CTX *exchange_hash_ctx;
  int rc;
  int ret;
  uchar packet_type_reply_local;
  uchar packet_type_init_local;
  BIGNUM *pBStack_28;
  int group_order_local;
  BIGNUM *p_local;
  BIGNUM *g_local;
  LIBSSH2_SESSION *session_local;
  
  exchange_hash_ctx._4_4_ = 0;
  rc._2_1_ = packet_type_reply;
  rc._3_1_ = packet_type_init;
  ret = group_order;
  pBStack_28 = (BIGNUM *)p;
  p_local = g;
  g_local = (BIGNUM *)session;
  if (exchange_state->state == libssh2_NB_state_idle) {
    exchange_state->e_packet = (uchar *)0x0;
    exchange_state->s_packet = (uchar *)0x0;
    exchange_state->k_value = (uchar *)0x0;
    pBVar7 = BN_CTX_new();
    exchange_state->ctx = (BN_CTX *)pBVar7;
    pBVar8 = BN_new();
    exchange_state->x = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->e = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->f = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar8;
    memset(&exchange_state->req_state,0,0x10);
    BN_rand((BIGNUM *)exchange_state->x,ret * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)exchange_state->e,(BIGNUM *)p_local,(BIGNUM *)exchange_state->x,pBStack_28,
               (BN_CTX *)exchange_state->ctx);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->e);
    exchange_state->e_packet_len = (long)((iVar4 + 7) / 8 + 6);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->e);
    if (iVar4 % 8 != 0) {
      exchange_state->e_packet_len = exchange_state->e_packet_len - 1;
    }
    puVar9 = (uchar *)(**(code **)(g_local + 8))(exchange_state->e_packet_len,g_local);
    exchange_state->e_packet = puVar9;
    if (exchange_state->e_packet == (uchar *)0x0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-6,"Out of memory error");
      goto LAB_0013a174;
    }
    *exchange_state->e_packet = rc._3_1_;
    _libssh2_htonu32(exchange_state->e_packet + 1,(int)exchange_state->e_packet_len - 5);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->e);
    if (iVar4 % 8 == 0) {
      exchange_state->e_packet[5] = '\0';
      BN_bn2bin((BIGNUM *)exchange_state->e,exchange_state->e_packet + 6);
    }
    else {
      BN_bn2bin((BIGNUM *)exchange_state->e,exchange_state->e_packet + 5);
    }
    exchange_state->state = libssh2_NB_state_created;
  }
  if (exchange_state->state == libssh2_NB_state_created) {
    exchange_hash_ctx._0_4_ =
         _libssh2_transport_send
                   ((LIBSSH2_SESSION *)g_local,exchange_state->e_packet,exchange_state->e_packet_len
                    ,(uchar *)0x0,0);
    if ((int)exchange_hash_ctx == -0x25) {
      return -0x25;
    }
    if ((int)exchange_hash_ctx != 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,(int)exchange_hash_ctx,
                             "Unable to send KEX init message");
      goto LAB_0013a174;
    }
    exchange_state->state = libssh2_NB_state_sent;
  }
  if (exchange_state->state == libssh2_NB_state_sent) {
    if (((byte)g_local[0x80] & 1) != 0) {
      fingerprint_ctx._4_4_ =
           _libssh2_packet_burn((LIBSSH2_SESSION *)g_local,&exchange_state->burn_state);
      if (fingerprint_ctx._4_4_ == -0x25) {
        return -0x25;
      }
      iVar4 = fingerprint_ctx._4_4_;
      if (fingerprint_ctx._4_4_ < 1) goto LAB_0013a174;
      g_local[0x80] = (BIGNUM)((byte)g_local[0x80] & 0xfe);
    }
    exchange_state->state = libssh2_NB_state_sent1;
  }
  if (exchange_state->state == libssh2_NB_state_sent1) {
    exchange_hash_ctx._0_4_ =
         _libssh2_packet_require
                   ((LIBSSH2_SESSION *)g_local,rc._2_1_,&exchange_state->s_packet,
                    &exchange_state->s_packet_len,0,(uchar *)0x0,0,&exchange_state->req_state);
    if ((int)exchange_hash_ctx == -0x25) {
      return -0x25;
    }
    if ((int)exchange_hash_ctx != 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-9,"Timed out waiting for KEX reply");
      goto LAB_0013a174;
    }
    exchange_state->s = exchange_state->s_packet + 1;
    uVar5 = _libssh2_ntohu32(exchange_state->s);
    *(uint *)(g_local + 0xb8) = uVar5;
    exchange_state->s = exchange_state->s + 4;
    if (*(long *)(g_local + 0xb0) != 0) {
      (**(code **)(g_local + 0x18))(*(undefined8 *)(g_local + 0xb0),g_local);
    }
    uVar10 = (**(code **)(g_local + 8))(*(undefined4 *)(g_local + 0xb8),g_local);
    *(undefined8 *)(g_local + 0xb0) = uVar10;
    if (*(long *)(g_local + 0xb0) == 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-6,
                             "Unable to allocate memory for a copy of the host key");
      goto LAB_0013a174;
    }
    memcpy(*(void **)(g_local + 0xb0),exchange_state->s,(ulong)*(uint *)(g_local + 0xb8));
    exchange_state->s = exchange_state->s + *(uint *)(g_local + 0xb8);
    iVar4 = _libssh2_md5_init(&fingerprint_ctx_1);
    if (iVar4 == 0) {
      *(undefined4 *)(g_local + 0xcc) = 0;
    }
    else {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx_1,*(void **)(g_local + 0xb0),
                       (ulong)*(uint *)(g_local + 0xb8));
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx_1,(uchar *)(g_local + 0xbc),(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx_1);
      *(undefined4 *)(g_local + 0xcc) = 1;
    }
    iVar4 = _libssh2_sha1_init((EVP_MD_CTX **)&iv);
    if (iVar4 == 0) {
      *(undefined4 *)(g_local + 0xe4) = 0;
    }
    else {
      EVP_DigestUpdate((EVP_MD_CTX *)iv,*(void **)(g_local + 0xb0),(ulong)*(uint *)(g_local + 0xb8))
      ;
      EVP_DigestFinal((EVP_MD_CTX *)iv,(uchar *)(g_local + 0xd0),(uint *)0x0);
      EVP_MD_CTX_free(iv);
      *(undefined4 *)(g_local + 0xe4) = 1;
    }
    iVar4 = (**(code **)(*(long *)(g_local + 0xa0) + 0x10))
                      (g_local,*(undefined8 *)(g_local + 0xb0),*(undefined4 *)(g_local + 0xb8),
                       g_local + 0xa8);
    if (iVar4 != 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-10,"Unable to initialize hostkey importer")
      ;
      goto LAB_0013a174;
    }
    uVar5 = _libssh2_ntohu32(exchange_state->s);
    exchange_state->f_value_len = (ulong)uVar5;
    exchange_state->s = exchange_state->s + 4;
    exchange_state->f_value = exchange_state->s;
    exchange_state->s = exchange_state->s + exchange_state->f_value_len;
    BN_bin2bn(exchange_state->f_value,(int)exchange_state->f_value_len,(BIGNUM *)exchange_state->f);
    uVar5 = _libssh2_ntohu32(exchange_state->s);
    exchange_state->h_sig_len = (ulong)uVar5;
    exchange_state->s = exchange_state->s + 4;
    exchange_state->h_sig = exchange_state->s;
    BN_mod_exp((BIGNUM *)exchange_state->k,(BIGNUM *)exchange_state->f,(BIGNUM *)exchange_state->x,
               pBStack_28,(BN_CTX *)exchange_state->ctx);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->k);
    exchange_state->k_value_len = (long)((iVar4 + 7) / 8 + 5);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->k);
    if (iVar4 % 8 != 0) {
      exchange_state->k_value_len = exchange_state->k_value_len - 1;
    }
    puVar9 = (uchar *)(**(code **)(g_local + 8))(exchange_state->k_value_len,g_local);
    exchange_state->k_value = puVar9;
    if (exchange_state->k_value == (uchar *)0x0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-6,"Unable to allocate buffer for K");
      goto LAB_0013a174;
    }
    _libssh2_htonu32(exchange_state->k_value,(int)exchange_state->k_value_len - 4);
    iVar4 = BN_num_bits((BIGNUM *)exchange_state->k);
    if (iVar4 % 8 == 0) {
      exchange_state->k_value[4] = '\0';
      BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 5);
    }
    else {
      BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 4);
    }
    exchange_state->exchange_hash = &stack0xffffffffffffffc0;
    _libssh2_sha1_init((EVP_MD_CTX **)&stack0xffffffffffffffc0);
    if (*(long *)(g_local + 0x158) == 0) {
      _libssh2_htonu32(exchange_state->h_sig_comp,0x15);
      EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
      EVP_DigestUpdate(pEStack_40,"SSH-2.0-libssh2_1.8.0",0x15);
    }
    else {
      sVar11 = strlen(*(char **)(g_local + 0x158));
      _libssh2_htonu32(exchange_state->h_sig_comp,(int)sVar11 - 2);
      EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
      pEVar3 = pEStack_40;
      pvVar1 = *(void **)(g_local + 0x158);
      sVar11 = strlen(*(char **)(g_local + 0x158));
      EVP_DigestUpdate(pEVar3,pvVar1,sVar11 - 2);
    }
    sVar11 = strlen(*(char **)(g_local + 0xe8));
    _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)sVar11);
    EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
    pEVar3 = pEStack_40;
    pvVar1 = *(void **)(g_local + 0xe8);
    sVar11 = strlen(*(char **)(g_local + 0xe8));
    EVP_DigestUpdate(pEVar3,pvVar1,sVar11);
    _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)*(undefined8 *)(g_local + 0x168));
    EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
    EVP_DigestUpdate(pEStack_40,*(void **)(g_local + 0x160),*(size_t *)(g_local + 0x168));
    _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)*(undefined8 *)(g_local + 0xf8));
    EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
    EVP_DigestUpdate(pEStack_40,*(void **)(g_local + 0xf0),*(size_t *)(g_local + 0xf8));
    _libssh2_htonu32(exchange_state->h_sig_comp,*(uint32_t *)(g_local + 0xb8));
    EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
    EVP_DigestUpdate(pEStack_40,*(void **)(g_local + 0xb0),(ulong)*(uint *)(g_local + 0xb8));
    if (rc._3_1_ == ' ') {
      _libssh2_htonu32(exchange_state->h_sig_comp,0x400);
      _libssh2_htonu32(exchange_state->h_sig_comp + 4,0x600);
      _libssh2_htonu32(exchange_state->h_sig_comp + 8,0x800);
      EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,0xc);
    }
    if (midhash != (uchar *)0x0) {
      EVP_DigestUpdate(pEStack_40,midhash,midhash_len);
    }
    EVP_DigestUpdate(pEStack_40,exchange_state->e_packet + 1,exchange_state->e_packet_len - 1);
    _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)exchange_state->f_value_len);
    EVP_DigestUpdate(pEStack_40,exchange_state->h_sig_comp,4);
    EVP_DigestUpdate(pEStack_40,exchange_state->f_value,exchange_state->f_value_len);
    EVP_DigestUpdate(pEStack_40,exchange_state->k_value,exchange_state->k_value_len);
    EVP_DigestFinal(pEStack_40,exchange_state->h_sig_comp,(uint *)0x0);
    EVP_MD_CTX_free(pEStack_40);
    iVar4 = (**(code **)(*(long *)(g_local + 0xa0) + 0x28))
                      (g_local,exchange_state->h_sig,exchange_state->h_sig_len,
                       exchange_state->h_sig_comp);
    if (iVar4 != 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-0xb,"Unable to verify hostkey signature");
      goto LAB_0013a174;
    }
    exchange_state->c = '\x15';
    exchange_state->state = libssh2_NB_state_sent2;
  }
  if (exchange_state->state == libssh2_NB_state_sent2) {
    exchange_hash_ctx._0_4_ =
         _libssh2_transport_send((LIBSSH2_SESSION *)g_local,&exchange_state->c,1,(uchar *)0x0,0);
    if ((int)exchange_hash_ctx == -0x25) {
      return -0x25;
    }
    if ((int)exchange_hash_ctx != 0) {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,(int)exchange_hash_ctx,
                             "Unable to send NEWKEYS message");
      goto LAB_0013a174;
    }
    exchange_state->state = libssh2_NB_state_sent3;
  }
  iVar4 = exchange_hash_ctx._4_4_;
  if (exchange_state->state == libssh2_NB_state_sent3) {
    uVar14 = 0;
    exchange_hash_ctx._0_4_ =
         _libssh2_packet_require
                   ((LIBSSH2_SESSION *)g_local,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,
                    0,(uchar *)0x0,0,&exchange_state->req_state);
    if ((int)exchange_hash_ctx == -0x25) {
      return -0x25;
    }
    if ((int)exchange_hash_ctx == 0) {
      *(uint *)(g_local + 0x68) = *(uint *)(g_local + 0x68) | 2;
      (**(code **)(g_local + 0x18))(exchange_state->tmp,g_local);
      uVar10 = extraout_RDX;
      if (*(long *)(g_local + 0x88) == 0) {
        uVar10 = (**(code **)(g_local + 8))(0x14,g_local);
        *(undefined8 *)(g_local + 0x88) = uVar10;
        if (*(long *)(g_local + 0x88) == 0) {
          iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,-6,
                                 "Unable to allocate buffer for SHA digest");
          goto LAB_0013a174;
        }
        puVar2 = *(undefined8 **)(g_local + 0x88);
        *puVar2 = *(undefined8 *)exchange_state->h_sig_comp;
        uVar10 = *(undefined8 *)(exchange_state->h_sig_comp + 8);
        puVar2[1] = uVar10;
        *(undefined4 *)(puVar2 + 2) = *(undefined4 *)(exchange_state->h_sig_comp + 0x10);
        *(undefined4 *)(g_local + 0x90) = 0x14;
      }
      if (*(long *)(*(long *)(g_local + 0x170) + 0x30) != 0) {
        (**(code **)(*(long *)(g_local + 0x170) + 0x30))(g_local,g_local + 0x178);
        uVar10 = extraout_RDX_00;
      }
      if (*(long *)(*(long *)(g_local + 0x170) + 0x20) != 0) {
        secret = (uchar *)0x0;
        _free_secret = (void *)0x0;
        hash._4_4_ = 0;
        hash._0_4_ = 0;
        hash_1 = (EVP_MD_CTX *)0x0;
        iVar4 = *(int *)(*(long *)(g_local + 0x170) + 0xc) + 0x14;
        auVar12 = (**(code **)(g_local + 8))((long)iVar4,g_local,uVar10,iVar4);
        if (auVar12._0_8_ != 0) {
          for (; secret = auVar12._0_8_,
              hash_1 < (EVP_MD_CTX *)(long)*(int *)(*(long *)(g_local + 0x170) + 0xc);
              hash_1 = hash_1 + 0x14) {
            _libssh2_sha1_init((EVP_MD_CTX **)&len);
            EVP_DigestUpdate((EVP_MD_CTX *)len,exchange_state->k_value,exchange_state->k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)len,exchange_state->h_sig_comp,0x14);
            if (hash_1 == (EVP_MD_CTX *)0x0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len,"A",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len,secret,(size_t)hash_1);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len,secret + (long)hash_1,(uint *)0x0);
            EVP_MD_CTX_free(len);
            auVar12._8_8_ = extraout_RDX_01;
            auVar12._0_8_ = secret;
          }
        }
        secret = auVar12._0_8_;
        if (secret == (uchar *)0x0) {
          exchange_hash_ctx._4_4_ = -1;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        iv_1 = (uchar *)0x0;
        if (_free_secret == (void *)0x0) {
          iVar4 = *(int *)(*(long *)(g_local + 0x170) + 0x10) + 0x14;
          _free_secret = (void *)(**(code **)(g_local + 8))((long)iVar4,g_local,auVar12._8_8_,iVar4)
          ;
        }
        uVar15 = (undefined4)(uVar14 >> 0x20);
        if (_free_secret != (void *)0x0) {
          for (; uVar15 = (undefined4)(uVar14 >> 0x20),
              iv_1 < (uchar *)(long)*(int *)(*(long *)(g_local + 0x170) + 0x10); iv_1 = iv_1 + 0x14)
          {
            _libssh2_sha1_init((EVP_MD_CTX **)&len_1);
            EVP_DigestUpdate((EVP_MD_CTX *)len_1,exchange_state->k_value,exchange_state->k_value_len
                            );
            EVP_DigestUpdate((EVP_MD_CTX *)len_1,exchange_state->h_sig_comp,0x14);
            if (iv_1 == (uchar *)0x0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len_1,"C",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len_1,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len_1,_free_secret,(size_t)iv_1);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len_1,(uchar *)((long)_free_secret + (long)iv_1),
                            (uint *)0x0);
            EVP_MD_CTX_free(len_1);
          }
        }
        if (_free_secret == (void *)0x0) {
          (**(code **)(g_local + 0x18))(secret,g_local);
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        uVar14 = CONCAT44(uVar15,1);
        iVar4 = (**(code **)(*(long *)(g_local + 0x170) + 0x20))
                          (g_local,*(undefined8 *)(g_local + 0x170),secret,(long)&hash + 4,
                           _free_secret,&hash,uVar14,g_local + 0x178);
        if (iVar4 != 0) {
          (**(code **)(g_local + 0x18))(secret,g_local);
          (**(code **)(g_local + 0x18))(_free_secret,g_local);
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        uVar10 = extraout_RDX_02;
        if (hash._4_4_ != 0) {
          memset(secret,0,(long)*(int *)(*(long *)(g_local + 0x170) + 0xc));
          (**(code **)(g_local + 0x18))(secret);
          uVar10 = extraout_RDX_03;
        }
        if ((int)hash != 0) {
          memset(_free_secret,0,(long)*(int *)(*(long *)(g_local + 0x170) + 0x10));
          (**(code **)(g_local + 0x18))(_free_secret,g_local);
          uVar10 = extraout_RDX_04;
        }
      }
      if (*(long *)(*(long *)(g_local + 0x100) + 0x30) != 0) {
        (**(code **)(*(long *)(g_local + 0x100) + 0x30))(g_local,g_local + 0x108);
        uVar10 = extraout_RDX_05;
      }
      if (*(long *)(*(long *)(g_local + 0x100) + 0x20) != 0) {
        secret_1 = (uchar *)0x0;
        _free_secret_1 = (void *)0x0;
        hash_2._4_4_ = 0;
        hash_2._0_4_ = 0;
        hash_3 = (EVP_MD_CTX *)0x0;
        iVar4 = *(int *)(*(long *)(g_local + 0x100) + 0xc) + 0x14;
        auVar13 = (**(code **)(g_local + 8))((long)iVar4,g_local,uVar10,iVar4);
        if (auVar13._0_8_ != 0) {
          for (; secret_1 = auVar13._0_8_,
              hash_3 < (EVP_MD_CTX *)(long)*(int *)(*(long *)(g_local + 0x100) + 0xc);
              hash_3 = hash_3 + 0x14) {
            _libssh2_sha1_init((EVP_MD_CTX **)&len_2);
            EVP_DigestUpdate((EVP_MD_CTX *)len_2,exchange_state->k_value,exchange_state->k_value_len
                            );
            EVP_DigestUpdate((EVP_MD_CTX *)len_2,exchange_state->h_sig_comp,0x14);
            if (hash_3 == (EVP_MD_CTX *)0x0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len_2,"B",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len_2,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len_2,secret_1,(size_t)hash_3);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len_2,secret_1 + (long)hash_3,(uint *)0x0);
            EVP_MD_CTX_free(len_2);
            auVar13._8_8_ = extraout_RDX_06;
            auVar13._0_8_ = secret_1;
          }
        }
        secret_1 = auVar13._0_8_;
        if (secret_1 == (uchar *)0x0) {
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        key = (uchar *)0x0;
        if (_free_secret_1 == (void *)0x0) {
          iVar4 = *(int *)(*(long *)(g_local + 0x100) + 0x10) + 0x14;
          _free_secret_1 =
               (void *)(**(code **)(g_local + 8))((long)iVar4,g_local,auVar13._8_8_,iVar4);
        }
        if (_free_secret_1 != (void *)0x0) {
          for (; key < (uchar *)(long)*(int *)(*(long *)(g_local + 0x100) + 0x10); key = key + 0x14)
          {
            _libssh2_sha1_init((EVP_MD_CTX **)&len_3);
            EVP_DigestUpdate((EVP_MD_CTX *)len_3,exchange_state->k_value,exchange_state->k_value_len
                            );
            EVP_DigestUpdate((EVP_MD_CTX *)len_3,exchange_state->h_sig_comp,0x14);
            if (key == (uchar *)0x0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len_3,"D",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len_3,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len_3,_free_secret_1,(size_t)key);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len_3,(uchar *)((long)_free_secret_1 + (long)key),
                            (uint *)0x0);
            EVP_MD_CTX_free(len_3);
          }
        }
        if (_free_secret_1 == (void *)0x0) {
          (**(code **)(g_local + 0x18))(secret_1,g_local);
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        iVar4 = (**(code **)(*(long *)(g_local + 0x100) + 0x20))
                          (g_local,*(undefined8 *)(g_local + 0x100),secret_1,(long)&hash_2 + 4,
                           _free_secret_1,&hash_2,uVar14 & 0xffffffff00000000,g_local + 0x108);
        if (iVar4 != 0) {
          (**(code **)(g_local + 0x18))(secret_1,g_local);
          (**(code **)(g_local + 0x18))(_free_secret_1,g_local);
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        uVar10 = extraout_RDX_07;
        if (hash_2._4_4_ != 0) {
          memset(secret_1,0,(long)*(int *)(*(long *)(g_local + 0x100) + 0xc));
          (**(code **)(g_local + 0x18))(secret_1);
          uVar10 = extraout_RDX_08;
        }
        if ((int)hash_2 != 0) {
          memset(_free_secret_1,0,(long)*(int *)(*(long *)(g_local + 0x100) + 0x10));
          (**(code **)(g_local + 0x18))(_free_secret_1,g_local);
          uVar10 = extraout_RDX_09;
        }
      }
      if (*(long *)(*(long *)(g_local + 0x180) + 0x20) != 0) {
        (**(code **)(*(long *)(g_local + 0x180) + 0x20))(g_local,g_local + 400);
        uVar10 = extraout_RDX_10;
      }
      if (*(long *)(*(long *)(g_local + 0x180) + 0x10) != 0) {
        pvStack_d0 = (void *)0x0;
        hash_4._4_4_ = 0;
        key_1 = (uchar *)0x0;
        iVar4 = *(int *)(*(long *)(g_local + 0x180) + 0xc) + 0x14;
        pvStack_d0 = (void *)(**(code **)(g_local + 8))((long)iVar4,g_local,uVar10,iVar4);
        if (pvStack_d0 != (void *)0x0) {
          for (; key_1 < (uchar *)(long)*(int *)(*(long *)(g_local + 0x180) + 0xc);
              key_1 = key_1 + 0x14) {
            _libssh2_sha1_init((EVP_MD_CTX **)&len_4);
            EVP_DigestUpdate((EVP_MD_CTX *)len_4,exchange_state->k_value,exchange_state->k_value_len
                            );
            EVP_DigestUpdate((EVP_MD_CTX *)len_4,exchange_state->h_sig_comp,0x14);
            if (key_1 == (uchar *)0x0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len_4,"E",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len_4,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len_4,pvStack_d0,(size_t)key_1);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len_4,(uchar *)((long)pvStack_d0 + (long)key_1),
                            (uint *)0x0);
            EVP_MD_CTX_free(len_4);
          }
        }
        if (pvStack_d0 == (void *)0x0) {
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        (**(code **)(*(long *)(g_local + 0x180) + 0x10))
                  (g_local,pvStack_d0,(long)&hash_4 + 4,g_local + 400);
        uVar10 = extraout_RDX_11;
        if (hash_4._4_4_ != 0) {
          memset(pvStack_d0,0,(long)*(int *)(*(long *)(g_local + 0x180) + 0xc));
          (**(code **)(g_local + 0x18))(pvStack_d0,g_local);
          uVar10 = extraout_RDX_12;
        }
      }
      if (*(long *)(*(long *)(g_local + 0x110) + 0x20) != 0) {
        (**(code **)(*(long *)(g_local + 0x110) + 0x20))(g_local,g_local + 0x120);
        uVar10 = extraout_RDX_13;
      }
      if (*(long *)(*(long *)(g_local + 0x110) + 0x10) != 0) {
        pvStack_f0 = (void *)0x0;
        hash_5._4_4_ = 0;
        local_108 = 0;
        iVar4 = *(int *)(*(long *)(g_local + 0x110) + 0xc) + 0x14;
        pvStack_f0 = (void *)(**(code **)(g_local + 8))((long)iVar4,g_local,uVar10,iVar4);
        if (pvStack_f0 != (void *)0x0) {
          for (; local_108 < (ulong)(long)*(int *)(*(long *)(g_local + 0x110) + 0xc);
              local_108 = local_108 + 0x14) {
            _libssh2_sha1_init((EVP_MD_CTX **)&len_5);
            EVP_DigestUpdate((EVP_MD_CTX *)len_5,exchange_state->k_value,exchange_state->k_value_len
                            );
            EVP_DigestUpdate((EVP_MD_CTX *)len_5,exchange_state->h_sig_comp,0x14);
            if (local_108 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)len_5,"F",1);
              EVP_DigestUpdate((EVP_MD_CTX *)len_5,*(void **)(g_local + 0x88),
                               (ulong)*(uint *)(g_local + 0x90));
            }
            else {
              EVP_DigestUpdate((EVP_MD_CTX *)len_5,pvStack_f0,local_108);
            }
            EVP_DigestFinal((EVP_MD_CTX *)len_5,(uchar *)((long)pvStack_f0 + local_108),(uint *)0x0)
            ;
            EVP_MD_CTX_free(len_5);
          }
        }
        if (pvStack_f0 == (void *)0x0) {
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
          goto LAB_0013a174;
        }
        (**(code **)(*(long *)(g_local + 0x110) + 0x10))
                  (g_local,pvStack_f0,(long)&hash_5 + 4,g_local + 0x120);
        if (hash_5._4_4_ != 0) {
          memset(pvStack_f0,0,(long)*(int *)(*(long *)(g_local + 0x110) + 0xc));
          (**(code **)(g_local + 0x18))(pvStack_f0,g_local);
        }
      }
      if ((*(long *)(g_local + 0x198) != 0) && (*(long *)(*(long *)(g_local + 0x198) + 0x28) != 0))
      {
        (**(code **)(*(long *)(g_local + 0x198) + 0x28))(g_local,1,g_local + 0x1a0);
      }
      if (((*(long *)(g_local + 0x198) == 0) || (*(long *)(*(long *)(g_local + 0x198) + 0x10) == 0))
         || (iVar4 = (**(code **)(*(long *)(g_local + 0x198) + 0x10))(g_local,1,g_local + 0x1a0),
            iVar4 == 0)) {
        if ((*(long *)(g_local + 0x128) != 0) && (*(long *)(*(long *)(g_local + 0x128) + 0x28) != 0)
           ) {
          (**(code **)(*(long *)(g_local + 0x128) + 0x28))(g_local,0,g_local + 0x130);
        }
        iVar4 = exchange_hash_ctx._4_4_;
        if (((*(long *)(g_local + 0x128) != 0) &&
            (*(long *)(*(long *)(g_local + 0x128) + 0x10) != 0)) &&
           (iVar6 = (**(code **)(*(long *)(g_local + 0x128) + 0x10))(g_local,0,g_local + 0x130),
           iVar4 = exchange_hash_ctx._4_4_, iVar6 != 0)) {
          exchange_hash_ctx._4_4_ = -5;
          iVar4 = exchange_hash_ctx._4_4_;
        }
      }
      else {
        exchange_hash_ctx._4_4_ = -5;
        iVar4 = exchange_hash_ctx._4_4_;
      }
    }
    else {
      iVar4 = _libssh2_error((LIBSSH2_SESSION *)g_local,(int)exchange_hash_ctx,
                             "Timed out waiting for NEWKEYS");
    }
  }
LAB_0013a174:
  exchange_hash_ctx._4_4_ = iVar4;
  BN_clear_free((BIGNUM *)exchange_state->x);
  exchange_state->x = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->e);
  exchange_state->e = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->f);
  exchange_state->f = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  BN_CTX_free((BN_CTX *)exchange_state->ctx);
  exchange_state->ctx = (BN_CTX *)0x0;
  if (exchange_state->e_packet != (uchar *)0x0) {
    (**(code **)(g_local + 0x18))(exchange_state->e_packet,g_local);
    exchange_state->e_packet = (uchar *)0x0;
  }
  if (exchange_state->s_packet != (uchar *)0x0) {
    (**(code **)(g_local + 0x18))(exchange_state->s_packet,g_local);
    exchange_state->s_packet = (uchar *)0x0;
  }
  if (exchange_state->k_value != (uchar *)0x0) {
    (**(code **)(g_local + 0x18))(exchange_state->k_value,g_local);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return exchange_hash_ctx._4_4_;
}

Assistant:

static int diffie_hellman_sha1(LIBSSH2_SESSION *session,
                               _libssh2_bn *g,
                               _libssh2_bn *p,
                               int group_order,
                               unsigned char packet_type_init,
                               unsigned char packet_type_reply,
                               unsigned char *midhash,
                               unsigned long midhash_len,
                               kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;
    libssh2_sha1_ctx exchange_hash_ctx;

    if (exchange_state->state == libssh2_NB_state_idle) {
        /* Setup initial values */
        exchange_state->e_packet = NULL;
        exchange_state->s_packet = NULL;
        exchange_state->k_value = NULL;
        exchange_state->ctx = _libssh2_bn_ctx_new();
        exchange_state->x = _libssh2_bn_init(); /* Random from client */
        exchange_state->e = _libssh2_bn_init(); /* g^x mod p */
        exchange_state->f = _libssh2_bn_init_from_bin(); /* g^(Random from server) mod p */
        exchange_state->k = _libssh2_bn_init(); /* The shared secret: f^x mod p */

        /* Zero the whole thing out */
        memset(&exchange_state->req_state, 0, sizeof(packet_require_state_t));

        /* Generate x and e */
        _libssh2_bn_rand(exchange_state->x, group_order * 8 - 1, 0, -1);
        _libssh2_bn_mod_exp(exchange_state->e, g, exchange_state->x, p,
                            exchange_state->ctx);

        /* Send KEX init */
        /* packet_type(1) + String Length(4) + leading 0(1) */
        exchange_state->e_packet_len =
            _libssh2_bn_bytes(exchange_state->e) + 6;
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            /* Leading 00 not needed */
            exchange_state->e_packet_len--;
        }

        exchange_state->e_packet =
            LIBSSH2_ALLOC(session, exchange_state->e_packet_len);
        if (!exchange_state->e_packet) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Out of memory error");
            goto clean_exit;
        }
        exchange_state->e_packet[0] = packet_type_init;
        _libssh2_htonu32(exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 5);
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 5);
        } else {
            exchange_state->e_packet[5] = 0;
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 6);
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending KEX packet %d",
                       (int) packet_type_init);
        exchange_state->state = libssh2_NB_state_created;
    }

    if (exchange_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, exchange_state->e_packet,
                                     exchange_state->e_packet_len,
                                     NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send KEX init message");
            goto clean_exit;
        }
        exchange_state->state = libssh2_NB_state_sent;
    }

    if (exchange_state->state == libssh2_NB_state_sent) {
        if (session->burn_optimistic_kexinit) {
            /* The first KEX packet to come along will be the guess initially
             * sent by the server.  That guess turned out to be wrong so we
             * need to silently ignore it */
            int burn_type;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Waiting for badly guessed KEX packet (to be ignored)");
            burn_type =
                _libssh2_packet_burn(session, &exchange_state->burn_state);
            if (burn_type == LIBSSH2_ERROR_EAGAIN) {
                return burn_type;
            } else if (burn_type <= 0) {
                /* Failed to receive a packet */
                ret = burn_type;
                goto clean_exit;
            }
            session->burn_optimistic_kexinit = 0;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Burnt packet of type: %02x",
                           (unsigned int) burn_type);
        }

        exchange_state->state = libssh2_NB_state_sent1;
    }

    if (exchange_state->state == libssh2_NB_state_sent1) {
        /* Wait for KEX reply */
        rc = _libssh2_packet_require(session, packet_type_reply,
                                     &exchange_state->s_packet,
                                     &exchange_state->s_packet_len, 0, NULL,
                                     0, &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        if (rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_TIMEOUT,
                                 "Timed out waiting for KEX reply");
            goto clean_exit;
        }

        /* Parse KEXDH_REPLY */
        exchange_state->s = exchange_state->s_packet + 1;

        session->server_hostkey_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;

        if (session->server_hostkey)
            LIBSSH2_FREE(session, session->server_hostkey);

        session->server_hostkey =
            LIBSSH2_ALLOC(session, session->server_hostkey_len);
        if (!session->server_hostkey) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host key");
            goto clean_exit;
        }
        memcpy(session->server_hostkey, exchange_state->s,
               session->server_hostkey_len);
        exchange_state->s += session->server_hostkey_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if (libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if (libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;

            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */

        if (session->hostkey->init(session, session->server_hostkey,
                                   session->server_hostkey_len,
                                   &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer");
            goto clean_exit;
        }

        exchange_state->f_value_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->f_value = exchange_state->s;
        exchange_state->s += exchange_state->f_value_len;
        _libssh2_bn_from_bin(exchange_state->f, exchange_state->f_value_len,
                             exchange_state->f_value);

        exchange_state->h_sig_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->h_sig = exchange_state->s;

        /* Compute the shared secret */
        _libssh2_bn_mod_exp(exchange_state->k, exchange_state->f,
                            exchange_state->x, p, exchange_state->ctx);
        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
            LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if (!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         exchange_state->k_value_len - 4);
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        } else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        exchange_state->exchange_hash = (void*)&exchange_hash_ctx;
        libssh2_sha1_init(&exchange_hash_ctx);

        if (session->local.banner) {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             strlen((char *) session->local.banner) - 2);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                (char *) session->local.banner,
                                strlen((char *) session->local.banner) - 2);
        } else {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                LIBSSH2_SSH_DEFAULT_BANNER,
                                sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
        }

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         strlen((char *) session->remote.banner));
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.banner,
                            strlen((char *) session->remote.banner));

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->local.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->local.kexinit,
                            session->local.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->remote.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.kexinit,
                            session->remote.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->server_hostkey_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->server_hostkey,
                            session->server_hostkey_len);

        if (packet_type_init == SSH_MSG_KEX_DH_GEX_INIT) {
            /* diffie-hellman-group-exchange hashes additional fields */
#ifdef LIBSSH2_DH_GEX_NEW
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_MINGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 4,
                             LIBSSH2_DH_GEX_OPTGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 8,
                             LIBSSH2_DH_GEX_MAXGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 12);
#else
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_OPTGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
#endif
        }

        if (midhash) {
            libssh2_sha1_update(exchange_hash_ctx, midhash,
                                midhash_len);
        }

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->e_packet + 1,
                            exchange_state->e_packet_len - 1);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         exchange_state->f_value_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->f_value,
                            exchange_state->f_value_len);

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->k_value,
                            exchange_state->k_value_len);

        libssh2_sha1_final(exchange_hash_ctx,
                           exchange_state->h_sig_comp);

        if (session->hostkey->
            sig_verify(session, exchange_state->h_sig,
                       exchange_state->h_sig_len, exchange_state->h_sig_comp,
                       20, &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature");
            goto clean_exit;
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending NEWKEYS message");
        exchange_state->c = SSH_MSG_NEWKEYS;

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if (exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Unable to send NEWKEYS message");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent3;
    }

    if (exchange_state->state == libssh2_NB_state_sent3) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Timed out waiting for NEWKEYS");
            goto clean_exit;
        }
        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Received NEWKEYS message");

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if (!session->session_id) {
            session->session_id = LIBSSH2_ALLOC(session, SHA_DIGEST_LENGTH);
            if (!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   SHA_DIGEST_LENGTH);
            session->session_id_len = SHA_DIGEST_LENGTH;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "session_id calculated");
        }

        /* Cleanup any existing cipher */
        if (session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if (session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->local.crypt->
                                                        iv_len, "A");
            if (!iv) {
                ret = -1;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->local.crypt->
                                                        secret_len, "C");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated");

        if (session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if (session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->remote.crypt->
                                                        iv_len, "B");
            if (!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->remote.crypt->
                                                        secret_len, "D");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated");

        if (session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if (session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->local.mac->
                                                        key_len, "E");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if (free_key) {
                memset(key, 0, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated");

        if (session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if (session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->remote.mac->
                                                        key_len, "F");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if (free_key) {
                memset(key, 0, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated");

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if (session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if (session->local.comp && session->local.comp->init) {
            if (session->local.comp->init(session, 1,
                                          &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized");

        if (session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if (session->remote.comp && session->remote.comp->init) {
            if (session->remote.comp->init(session, 0,
                                           &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized");

    }

  clean_exit:
    _libssh2_bn_free(exchange_state->x);
    exchange_state->x = NULL;
    _libssh2_bn_free(exchange_state->e);
    exchange_state->e = NULL;
    _libssh2_bn_free(exchange_state->f);
    exchange_state->f = NULL;
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;
    _libssh2_bn_ctx_free(exchange_state->ctx);
    exchange_state->ctx = NULL;

    if (exchange_state->e_packet) {
        LIBSSH2_FREE(session, exchange_state->e_packet);
        exchange_state->e_packet = NULL;
    }

    if (exchange_state->s_packet) {
        LIBSSH2_FREE(session, exchange_state->s_packet);
        exchange_state->s_packet = NULL;
    }

    if (exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}